

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

int __thiscall bdQuery::addProxy(bdQuery *this,bdId *id,bdId *src,uint32_t srcmode)

{
  int iVar1;
  time_t tVar2;
  undefined1 local_98 [8];
  bdPeer peer;
  bool found;
  int bucket;
  time_t now;
  bdMetric dist;
  uint32_t srcmode_local;
  bdId *src_local;
  bdId *id_local;
  bdQuery *this_local;
  
  dist.super_bdNodeId.data._12_4_ = srcmode;
  unique0x1000019b = src;
  tVar2 = time((time_t *)0x0);
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,&id->id,&now);
  peer._68_4_ = (*this->mFns->_vptr_bdDhtFunctions[6])(this->mFns,&now);
  if ((peer._68_4_ == 0) && (stack0xffffffffffffffd8 != (bdId *)0x0)) {
    peer.mExtraFlags._3_1_ = 0;
    iVar1 = updateProxyList(this,stack0xffffffffffffffd8,dist.super_bdNodeId.data._12_4_,
                            &this->mProxiesUnknown);
    if (iVar1 != 0) {
      peer.mExtraFlags._3_1_ = 1;
    }
    if (((peer.mExtraFlags._3_1_ & 1) == 0) &&
       (iVar1 = updateProxyList(this,stack0xffffffffffffffd8,dist.super_bdNodeId.data._12_4_,
                                &this->mProxiesFlagged), iVar1 != 0)) {
      peer.mExtraFlags._3_1_ = 1;
    }
    if ((peer.mExtraFlags._3_1_ & 1) == 0) {
      bdPeer::bdPeer((bdPeer *)local_98);
      memcpy(local_98,stack0xffffffffffffffd8,0x24);
      peer.mPeerId.id.data[0xc] = dist.super_bdNodeId.data[0xc];
      peer.mPeerId.id.data[0xd] = dist.super_bdNodeId.data[0xd];
      peer.mPeerId.id.data[0xe] = dist.super_bdNodeId.data[0xe];
      peer.mPeerId.id.data[0xf] = dist.super_bdNodeId.data[0xf];
      peer.mPeerId.id.data[0x10] = '\0';
      peer.mPeerId.id.data[0x11] = '\0';
      peer.mPeerId.id.data[0x12] = '\0';
      peer.mPeerId.id.data[0x13] = '\0';
      peer.mPeerFlags = 0;
      peer.mLastSendTime = tVar2;
      peer.mLastRecvTime = tVar2;
      if ((dist.super_bdNodeId.data._12_4_ & this->mRequiredPeerFlags) == this->mRequiredPeerFlags)
      {
        std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::push_front
                  (&this->mProxiesFlagged,(value_type *)local_98);
      }
      else {
        std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::push_front
                  (&this->mProxiesUnknown,(value_type *)local_98);
      }
    }
    trimProxies(this);
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int bdQuery::addProxy(const bdId *id, const bdId *src, uint32_t srcmode) {
	bdMetric dist;
	time_t now = time(NULL);
	
	mFns->bdDistance(&mId, &(id->id), &dist);
	
	/* finally if it is an exact match, add as potential proxy */
	int bucket = mFns->bdBucketDistance(&dist);
	if ((bucket != 0) || (src == NULL))
		/* not a potential proxy */
		return 0;

#ifdef DEBUG_QUERY 
	fprintf(stderr, "Bucket = 0, Have Potential Proxy!\n");
#endif

	bool found = false;
	if (updateProxyList(src, srcmode, mProxiesUnknown))
		found = true;

	if (!found)
		if (updateProxyList(src, srcmode, mProxiesFlagged))
			found = true;

	if (!found) {
		/* if we get here. its not in the list */
#ifdef DEBUG_QUERY 
		fprintf(stderr, "Adding Source to Proxy List:\n");
#endif
		bdPeer peer;
		peer.mPeerId = *src;
		peer.mPeerFlags = srcmode;
		peer.mLastSendTime = 0;
		peer.mLastRecvTime = now;
		peer.mFoundTime = now;
	
		/* add it in */
		if ((srcmode & mRequiredPeerFlags) == mRequiredPeerFlags)
			mProxiesFlagged.push_front(peer);
		else
			mProxiesUnknown.push_front(peer);
	}

	trimProxies();
	
	return 1;
}